

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::LifetimeTests::details::FboInputAttacher::drawContainer
          (FboInputAttacher *this,GLuint fbo,Surface *dst)

{
  ostringstream *this_00;
  MessageBuilder local_198;
  
  drawFbo(&(this->super_InputAttacher).super_ContextWrapper.m_ctx,fbo,dst);
  local_198.m_log = ((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_testCtx)->m_log;
  this_00 = &local_198.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"// Read pixels from framebuffer ");
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::operator<<((ostream *)this_00," to output image.");
  tcu::MessageBuilder::operator<<(&local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  return;
}

Assistant:

void FboInputAttacher::drawContainer (GLuint fbo, Surface& dst)
{
	drawFbo(getContext(), fbo, dst);
	log() << TestLog::Message
		  << "// Read pixels from framebuffer " << fbo << " to output image."
		  << TestLog::EndMessage;
}